

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mpi_miller_rabin(mbedtls_mpi *X,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi A;
  mbedtls_mpi W;
  mbedtls_mpi R;
  mbedtls_mpi T;
  mbedtls_mpi RR;
  mbedtls_mpi _B;
  mbedtls_mpi_uint local_4e0;
  void *local_4d8;
  mbedtls_mpi local_4d0;
  mbedtls_mpi local_4b8;
  size_t local_4a0;
  long local_498;
  _func_int_void_ptr_uchar_ptr_size_t *local_490;
  mbedtls_mpi local_488;
  long local_470;
  mbedtls_mpi local_468;
  mbedtls_mpi local_450;
  mbedtls_mpi local_438 [43];
  
  local_4b8.s = 1;
  local_4b8.n = 0;
  local_4b8.p = (mbedtls_mpi_uint *)0x0;
  local_488.s = 1;
  local_488.n = 0;
  local_488.p = (mbedtls_mpi_uint *)0x0;
  local_468.s = 1;
  local_468.n = 0;
  local_468.p = (mbedtls_mpi_uint *)0x0;
  local_4d0.s = 1;
  local_4d0.n = 0;
  local_4d0.p = (ulong *)0x0;
  local_450.s = 1;
  local_450.n = 0;
  local_450.p = (mbedtls_mpi_uint *)0x0;
  local_438[0].p = &local_4e0;
  local_4e0 = 1;
  local_438[0].s = 1;
  local_438[0].n = 1;
  iVar1 = mbedtls_mpi_sub_mpi(&local_4b8,X,local_438);
  if (iVar1 == 0) {
    if (local_4b8.n == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = 0;
      lVar3 = 0;
      sVar5 = 0;
      do {
        uVar6 = 0;
        do {
          if ((local_4b8.p[sVar5] >> (uVar6 & 0x3f) & 1) != 0) {
            sVar2 = uVar6 - lVar3;
            goto LAB_001138f9;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != 0x40);
        sVar5 = sVar5 + 1;
        lVar3 = lVar3 + -0x40;
      } while (sVar5 != local_4b8.n);
    }
LAB_001138f9:
    iVar1 = mbedtls_mpi_copy(&local_488,&local_4b8);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_r(&local_488,sVar2), iVar1 == 0)) {
      local_4a0 = sVar2;
      local_490 = f_rng;
      sVar2 = mbedtls_mpi_bitlen(X);
      local_470 = 2;
      if ((sVar2 < 0x514) &&
         ((((local_470 = 3, sVar2 < 0x352 && (local_470 = 4, sVar2 < 0x28a)) &&
           (local_470 = 8, sVar2 < 0x15e)) && (local_470 = 0xc, sVar2 < 0xfa)))) {
        local_470 = (ulong)(sVar2 < 0x96) * 9 + 0x12;
      }
      lVar3 = 0;
LAB_00113add:
      uVar6 = X->n << 3;
      local_498 = lVar3;
      if (uVar6 < 0x401) {
        iVar1 = (*local_490)(p_rng,(uchar *)local_438,uVar6);
        if (iVar1 == 0) {
          iVar1 = mbedtls_mpi_read_binary(&local_4d0,(uchar *)local_438,uVar6);
          if (iVar1 == 0) {
            iVar1 = mbedtls_mpi_cmp_mpi(&local_4d0,&local_4b8);
            if (-1 < iVar1) {
              sVar2 = mbedtls_mpi_bitlen(&local_4d0);
              sVar5 = mbedtls_mpi_bitlen(&local_4b8);
              iVar1 = mbedtls_mpi_shift_r(&local_4d0,(sVar2 - sVar5) + 1);
              if (iVar1 != 0) goto LAB_00113923;
            }
            *local_4d0.p = *local_4d0.p | 3;
            sVar2 = X->n << 3;
            iVar1 = -4;
            if (sVar2 < 0x401) {
              iVar4 = 0x20;
              local_4d8 = p_rng;
              do {
                iVar1 = (*local_490)(local_4d8,(uchar *)local_438,sVar2);
                if (iVar1 != 0) break;
                iVar1 = mbedtls_mpi_read_binary(&local_4d0,(uchar *)local_438,sVar2);
                if (iVar1 != 0) break;
                sVar2 = mbedtls_mpi_bitlen(&local_4d0);
                sVar5 = mbedtls_mpi_bitlen(&local_4b8);
                if ((sVar5 <= sVar2 && sVar2 - sVar5 != 0) &&
                   (iVar1 = mbedtls_mpi_shift_r(&local_4d0,sVar2 - sVar5), iVar1 != 0)) break;
                iVar4 = iVar4 + -1;
                if (iVar4 == 0) {
                  return -0xe;
                }
                iVar1 = mbedtls_mpi_cmp_mpi(&local_4d0,&local_4b8);
                if (iVar1 < 0) {
                  local_4e0 = 1;
                  local_438[0].s = 1;
                  local_438[0].n = 1;
                  local_438[0].p = &local_4e0;
                  iVar1 = mbedtls_mpi_cmp_mpi(&local_4d0,local_438);
                  if (0 < iVar1) goto LAB_00113c78;
                }
                sVar2 = X->n << 3;
                iVar1 = -4;
                if (0x400 < sVar2) break;
              } while( true );
            }
          }
        }
      }
      else {
        iVar1 = -4;
      }
    }
  }
LAB_00113923:
  if (local_4b8.p != (mbedtls_mpi_uint *)0x0) {
    if (local_4b8.n != 0) {
      sVar2 = 0;
      do {
        local_4b8.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_4b8.n != sVar2);
    }
    free(local_4b8.p);
  }
  local_4b8.s = 1;
  local_4b8.n = 0;
  local_4b8.p = (mbedtls_mpi_uint *)0x0;
  if (local_488.p != (mbedtls_mpi_uint *)0x0) {
    if (local_488.n != 0) {
      sVar2 = 0;
      do {
        local_488.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_488.n != sVar2);
    }
    free(local_488.p);
  }
  local_488.s = 1;
  local_488.n = 0;
  local_488.p = (mbedtls_mpi_uint *)0x0;
  if (local_468.p != (mbedtls_mpi_uint *)0x0) {
    if (local_468.n != 0) {
      sVar2 = 0;
      do {
        local_468.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_468.n != sVar2);
    }
    free(local_468.p);
  }
  local_468.s = 1;
  local_468.n = 0;
  local_468.p = (mbedtls_mpi_uint *)0x0;
  if (local_4d0.p != (ulong *)0x0) {
    if (local_4d0.n != 0) {
      sVar2 = 0;
      do {
        local_4d0.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_4d0.n != sVar2);
    }
    free(local_4d0.p);
  }
  local_4d0.s = 1;
  local_4d0.n = 0;
  local_4d0.p = (mbedtls_mpi_uint *)0x0;
  if (local_450.p != (mbedtls_mpi_uint *)0x0) {
    if (local_450.n != 0) {
      sVar2 = 0;
      do {
        local_450.p[sVar2] = 0;
        sVar2 = sVar2 + 1;
      } while (local_450.n != sVar2);
    }
    free(local_450.p);
  }
  return iVar1;
LAB_00113c78:
  iVar1 = mbedtls_mpi_exp_mod(&local_4d0,&local_4d0,&local_488,X,&local_450);
  if (iVar1 != 0) goto LAB_00113923;
  iVar1 = mbedtls_mpi_cmp_mpi(&local_4d0,&local_4b8);
  lVar3 = local_498;
  p_rng = local_4d8;
  if (iVar1 != 0) {
    local_4e0 = 1;
    local_438[0].s = 1;
    local_438[0].n = 1;
    local_438[0].p = &local_4e0;
    iVar1 = mbedtls_mpi_cmp_mpi(&local_4d0,local_438);
    if (iVar1 != 0) {
      if (1 < local_4a0) {
        uVar6 = 2;
        while (iVar1 = mbedtls_mpi_cmp_mpi(&local_4d0,&local_4b8), iVar1 != 0) {
          iVar1 = mbedtls_mpi_mul_mpi(&local_468,&local_4d0,&local_4d0);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_mod_mpi(&local_4d0,&local_468,X), iVar1 != 0))
          goto LAB_00113923;
          local_4e0 = 1;
          local_438[0].s = 1;
          local_438[0].n = 1;
          local_438[0].p = &local_4e0;
          iVar1 = mbedtls_mpi_cmp_mpi(&local_4d0,local_438);
          if ((iVar1 == 0) || (bVar7 = local_4a0 <= uVar6, uVar6 = uVar6 + 1, bVar7)) break;
        }
      }
      iVar4 = mbedtls_mpi_cmp_mpi(&local_4d0,&local_4b8);
      iVar1 = -0xe;
      if (iVar4 != 0) goto LAB_00113923;
      local_4e0 = 1;
      local_438[0].s = 1;
      local_438[0].n = 1;
      local_438[0].p = &local_4e0;
      iVar4 = mbedtls_mpi_cmp_mpi(&local_4d0,local_438);
      p_rng = local_4d8;
      lVar3 = local_498;
      if (iVar4 == 0) goto LAB_00113923;
    }
  }
  lVar3 = lVar3 + 1;
  iVar1 = 0;
  if (lVar3 == local_470) goto LAB_00113923;
  goto LAB_00113add;
}

Assistant:

static int mpi_miller_rabin( const mbedtls_mpi *X,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng )
{
    int ret, count;
    size_t i, j, k, n, s;
    mbedtls_mpi W, R, T, A, RR;

    mbedtls_mpi_init( &W ); mbedtls_mpi_init( &R ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &A );
    mbedtls_mpi_init( &RR );

    /*
     * W = |X| - 1
     * R = W >> lsb( W )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &W, X, 1 ) );
    s = mbedtls_mpi_lsb( &W );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R, &W ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &R, s ) );

    i = mbedtls_mpi_bitlen( X );
    /*
     * HAC, table 4.4
     */
    n = ( ( i >= 1300 ) ?  2 : ( i >=  850 ) ?  3 :
          ( i >=  650 ) ?  4 : ( i >=  350 ) ?  8 :
          ( i >=  250 ) ? 12 : ( i >=  150 ) ? 18 : 27 );

    for( i = 0; i < n; i++ )
    {
        /*
         * pick a random A, 1 < A < |X| - 1
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 )
        {
            j = mbedtls_mpi_bitlen( &A ) - mbedtls_mpi_bitlen( &W );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j + 1 ) );
        }
        A.p[0] |= 3;

        count = 0;
        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

            j = mbedtls_mpi_bitlen( &A );
            k = mbedtls_mpi_bitlen( &W );
            if (j > k) {
                MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j - k ) );
            }

            if (count++ > 30) {
                return MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            }

        } while ( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 ||
                  mbedtls_mpi_cmp_int( &A, 1 )  <= 0    );

        /*
         * A = A^R mod |X|
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &A, &A, &R, X, &RR ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) == 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
            continue;

        j = 1;
        while( j < s && mbedtls_mpi_cmp_mpi( &A, &W ) != 0 )
        {
            /*
             * A = A * A mod |X|
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &A, &A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &A, &T, X  ) );

            if( mbedtls_mpi_cmp_int( &A, 1 ) == 0 )
                break;

            j++;
        }

        /*
         * not prime if A != |X| - 1 or A == 1
         */
        if( mbedtls_mpi_cmp_mpi( &A, &W ) != 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
        {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            break;
        }
    }

cleanup:
    mbedtls_mpi_free( &W ); mbedtls_mpi_free( &R ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &A );
    mbedtls_mpi_free( &RR );

    return( ret );
}